

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprog.c
# Opt level: O0

void pulse_prog_demon(CHAR_DATA *mob)

{
  long lVar1;
  int iVar2;
  long in_RDI;
  char buf [250];
  CHAR_DATA *victim;
  CHAR_DATA *elemental;
  CHAR_DATA *in_stack_00000118;
  CHAR_DATA *in_stack_00000120;
  char *in_stack_000035a8;
  CHAR_DATA *in_stack_000035b0;
  void *in_stack_fffffffffffffee8;
  void *in_stack_fffffffffffffef0;
  CHAR_DATA *in_stack_fffffffffffffef8;
  char *in_stack_ffffffffffffff00;
  ROOM_INDEX_DATA *in_stack_ffffffffffffff18;
  CHAR_DATA *in_stack_ffffffffffffff20;
  CHAR_DATA *in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffffcf;
  CHAR_DATA *in_stack_ffffffffffffffd0;
  
  lVar1 = *(long *)(in_RDI + 0x58);
  if ((((lVar1 == 0) || (*(long *)(in_RDI + 0xa8) == 0)) || (*(long *)(lVar1 + 0xa8) == 0)) ||
     (0 < *(short *)(lVar1 + 0x2dc))) {
    if ((*(long *)(in_RDI + 0x10) != 0) && (0 < *(short *)(lVar1 + 0x2dc))) {
      sprintf(&stack0xfffffffffffffee8,
              "%s I have taken the soul of %s. Your debt will one day be collected.",
              *(undefined8 *)(*(long *)(in_RDI + 0x10) + 0xe8),*(undefined8 *)(lVar1 + 0xe8));
      do_tell(in_stack_000035b0,in_stack_000035a8);
    }
    act(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
        in_stack_fffffffffffffee8,0);
    extract_char(in_stack_ffffffffffffffd0,(bool)in_stack_ffffffffffffffcf);
  }
  else {
    iVar2 = number_percent();
    if ((iVar2 < 0x33) && (*(long *)(in_RDI + 0x20) == 0)) {
      if (*(short *)(in_RDI + 0x1f8) != 8) {
        *(undefined2 *)(in_RDI + 0x1f8) = 8;
      }
      if (*(short *)(*(long *)(lVar1 + 0xa8) + 0x13a) !=
          *(short *)(*(long *)(in_RDI + 0xa8) + 0x13a)) {
        act(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
            in_stack_fffffffffffffee8,0);
        char_from_room(in_stack_ffffffffffffff40);
        char_to_room(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
        act(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
            in_stack_fffffffffffffee8,0);
        act(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
            in_stack_fffffffffffffee8,0);
      }
      act(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
          in_stack_fffffffffffffee8,0);
      act(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
          in_stack_fffffffffffffee8,0);
      multi_hit(in_stack_00000120,in_stack_00000118,mob._4_4_);
    }
  }
  return;
}

Assistant:

void pulse_prog_demon(CHAR_DATA *mob)
{
	CHAR_DATA *elemental = mob;
	CHAR_DATA *victim = elemental->hunting;
	char buf[250];

	if (!victim || !elemental->in_room || !victim->in_room || victim->ghost > 0)
	{
		if (mob->master && victim->ghost > 0)
		{
			sprintf(buf, "%s I have taken the soul of %s. Your debt will one day be collected.", mob->master->name, victim->name);
			do_tell(mob, buf);
		}

		act("$n returns to the Hells.", elemental, 0, 0, TO_ALL);
		extract_char(mob, true);
		return;
	}

	if (number_percent() > 50)
		return;

	if (elemental->fighting)
		return;

	if (mob->position != POS_STANDING)
		mob->position = POS_STANDING;

	if (victim->in_room->vnum != elemental->in_room->vnum)
	{
		act("$n steps through a portal, seeking $s prey.", elemental, 0, 0, TO_ALL);

		char_from_room(elemental);
		char_to_room(elemental, victim->in_room);

		act("$n arrives through a portal, seeking $N's blood!", elemental, 0, victim, TO_NOTVICT);
		act("$n arrives through a portal, seeking your blood!", elemental, 0, victim, TO_VICT);
	}

	act("$n gestures at $N, uttering curses.", elemental, 0, victim, TO_NOTVICT);
	act("$n gestures at you, uttering curses.", elemental, 0, victim, TO_VICT);

	multi_hit(elemental, victim, TYPE_UNDEFINED);
}